

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedbook.c
# Opt level: O1

void vorbis_staticbook_destroy(static_codebook *b)

{
  if (b->allocedp != 0) {
    if (b->quantlist != (long *)0x0) {
      free(b->quantlist);
    }
    if (b->lengthlist != (char *)0x0) {
      free(b->lengthlist);
    }
    b->q_quant = 0;
    b->q_sequencep = 0;
    b->quantlist = (long *)0x0;
    b->q_min = 0;
    b->q_delta = 0;
    b->lengthlist = (char *)0x0;
    *(undefined8 *)&b->maptype = 0;
    b->dim = 0;
    b->entries = 0;
    *(undefined8 *)&b->allocedp = 0;
    free(b);
    return;
  }
  return;
}

Assistant:

void vorbis_staticbook_destroy(static_codebook *b){
  if(b->allocedp){
    if(b->quantlist)_ogg_free(b->quantlist);
    if(b->lengthlist)_ogg_free(b->lengthlist);
    memset(b,0,sizeof(*b));
    _ogg_free(b);
  } /* otherwise, it is in static memory */
}